

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Point2f __thiscall pbrt::SphericalMapping2D::Sphere(SphericalMapping2D *this,Point3f *p)

{
  undefined1 auVar1 [16];
  float fVar2;
  Tuple2<pbrt::Point2,_float> TVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Vector3<float> v;
  Tuple3<pbrt::Vector3,_float> local_10;
  undefined1 extraout_var [60];
  
  auVar6 = in_ZMM0._8_56_;
  PVar7 = Transform::operator()(&this->textureFromRender,p);
  local_10.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_10._0_8_ = vmovlps_avx(auVar4._0_16_);
  v = Normalize<float>((Vector3<float> *)&local_10);
  fVar2 = SafeACos(v.super_Tuple3<pbrt::Vector3,_float>.z);
  auVar5._0_4_ = SphericalPhi((Vector3f)v.super_Tuple3<pbrt::Vector3,_float>);
  auVar5._4_60_ = extraout_var;
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = fVar2;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vinsertps_avx(auVar1,auVar5._0_16_,0x10);
  TVar3.x = auVar1._0_4_ * 0.31830987;
  TVar3.y = auVar1._4_4_ * 0.15915494;
  return (Point2f)TVar3;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sphere(const Point3f &p) const {
        Vector3f vec = Normalize(textureFromRender(p) - Point3f(0, 0, 0));
        Float theta = SphericalTheta(vec), phi = SphericalPhi(vec);
        return {theta * InvPi, phi * Inv2Pi};
    }